

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPartHelper.h
# Opt level: O3

void __thiscall Imf_2_5::MultiViewChannelName::~MultiViewChannelName(MultiViewChannelName *this)

{
  ~MultiViewChannelName(this);
  operator_delete(this,0x70);
  return;
}

Assistant:

virtual ~MultiViewChannelName() {}